

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxSoundCast::Resolve(FxSoundCast *this,FCompileContext *ctx)

{
  PType *pPVar1;
  PSound *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 uVar4;
  FxExpression *pFVar5;
  FScriptPosition *other;
  ExpVal constval;
  ExpVal local_40;
  FString local_30;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->basex != (FxExpression *)0x0) {
    iVar3 = (*this->basex->_vptr_FxExpression[2])();
    this->basex = (FxExpression *)CONCAT44(extraout_var,iVar3);
  }
  if (this->basex == (FxExpression *)0x0) {
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return (FxExpression *)0x0;
  }
  pPVar1 = this->basex->ValueType;
  if (pPVar1 != (PType *)TypeSound) {
    if (*(long *)(&((PInt *)&pPVar1->super_PTypeBase)->field_0x0 + 8) == 0) {
      uVar4 = (*(code *)**(undefined8 **)&pPVar1->super_PTypeBase)(pPVar1);
      *(undefined8 *)(&((PInt *)&pPVar1->super_PTypeBase)->field_0x0 + 8) = uVar4;
    }
    if (*(PClass **)(&((PInt *)&pPVar1->super_PTypeBase)->field_0x0 + 8) !=
        PInt::RegistrationInfo.MyClass) {
      if (this->basex->ValueType == (PType *)TypeString) {
        iVar3 = (*this->basex->_vptr_FxExpression[3])();
        if ((char)iVar3 == '\0') {
          return &this->super_FxExpression;
        }
        local_40.field_1 =
             (anon_union_8_3_addc324a_for_ExpVal_1)
             ((anon_union_8_3_addc324a_for_ExpVal_1 *)(this->basex + 1))->pointer;
        other = &this->basex[1].ScriptPosition;
        if ((PString *)local_40.field_1.pointer == TypeString) {
          FString::AttachToOther(&local_30,&other->FileName);
        }
        else {
          local_30.Chars = (other->FileName).Chars;
        }
        pFVar5 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
        ExpVal::GetString(&local_40);
        iVar3 = S_FindSound((char *)local_40.Type);
        pFVar5->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
        FScriptPosition::FScriptPosition
                  (&pFVar5->ScriptPosition,&(this->super_FxExpression).ScriptPosition);
        pFVar5->ValueType = (PType *)0x0;
        pFVar5->isresolved = false;
        pFVar5->NeedResult = true;
        pFVar5->ExprType = EFX_Constant;
        pFVar5->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_007113e8;
        pFVar5[1]._vptr_FxExpression = (_func_int **)TypeSInt32;
        *(undefined4 *)&pFVar5[1].ScriptPosition.FileName.Chars = 0;
        pPVar2 = TypeSound;
        pFVar5[1]._vptr_FxExpression = (_func_int **)TypeSound;
        pFVar5->ValueType = (PType *)pPVar2;
        *(int *)&pFVar5[1].ScriptPosition.FileName.Chars = iVar3;
        pFVar5->isresolved = true;
        FString::~FString((FString *)&local_40);
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        if ((PString *)local_40.field_1.pointer != TypeString) {
          return pFVar5;
        }
        FString::~FString(&local_30);
        return pFVar5;
      }
      pFVar5 = (FxExpression *)0x0;
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"Cannot convert to sound");
      goto LAB_0052441f;
    }
  }
  pFVar5 = this->basex;
  pFVar5->ValueType = (PType *)TypeSound;
  this->basex = (FxExpression *)0x0;
LAB_0052441f:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return pFVar5;
}

Assistant:

FxExpression *FxSoundCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType == TypeSound || basex->ValueType->GetClass() == RUNTIME_CLASS(PInt))
	{
		FxExpression *x = basex;
		x->ValueType = TypeSound;
		basex = nullptr;
		delete this;
		return x;
	}
	else if (basex->ValueType == TypeString)
	{
		if (basex->isConstant())
		{
			ExpVal constval = static_cast<FxConstant *>(basex)->GetValue();
			FxExpression *x = new FxConstant(FSoundID(constval.GetString()), ScriptPosition);
			delete this;
			return x;
		}
		return this;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Cannot convert to sound");
		delete this;
		return nullptr;
	}
}